

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O0

void __thiscall
Jupiter::HTTP::Server::Content::Content(Content *this,string *in_name,HTTPFunction *in_function)

{
  uint uVar1;
  HTTPFunction *in_function_local;
  string *in_name_local;
  Content *this_local;
  
  this->_vptr_Content = (_func_int **)&PTR_execute_abi_cxx11__001ea2a8;
  this->free_result = true;
  std::__cxx11::string::string((string *)&this->name,in_name);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&this->language);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&this->type);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&this->charset);
  this->function = in_function;
  uVar1 = calc_checksum<unsigned_int,std::__cxx11::string>(&this->name);
  this->name_checksum = uVar1;
  return;
}

Assistant:

Jupiter::HTTP::Server::Content::Content(std::string in_name, Jupiter::HTTP::Server::HTTPFunction in_function)
	: name(std::move(in_name)) {
	Jupiter::HTTP::Server::Content::function = in_function;
	Jupiter::HTTP::Server::Content::name_checksum = calc_checksum(name); // switch to calcChecksumi to make case-insensitive
}